

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void vec_gen_op3(TCGContext_conflict9 *tcg_ctx,TCGOpcode opc,uint vece,TCGv_vec r,TCGv_vec a,
                TCGv_vec b)

{
  undefined4 in_register_00000014;
  
  vec_gen_3_tricore(tcg_ctx,opc,
                    (uint)*(byte *)((long)&tcg_ctx->pool_cur +
                                   CONCAT44(in_register_00000014,vece) + 2),0,
                    (long)&tcg_ctx->pool_cur + CONCAT44(in_register_00000014,vece),
                    (TCGArg)(r + (long)tcg_ctx),(TCGArg)(a + (long)tcg_ctx));
  return;
}

Assistant:

static void vec_gen_op3(TCGContext *tcg_ctx, TCGOpcode opc, unsigned vece,
                        TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGType type = rt->base_type;

    /* Must enough inputs for the output.  */
    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    vec_gen_3(tcg_ctx, opc, type, vece, temp_arg(rt), temp_arg(at), temp_arg(bt));
}